

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index index)

{
  Scalar SVar1;
  BlockImpl_dense<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true,_true> local_230;
  Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1,_2,_false>
  local_200;
  undefined1 local_170 [144];
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1,_2,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true>_>_>
  local_e0 [144];
  PointerType local_50;
  undefined8 uStack_48;
  XprTypeNested local_40;
  long lStack_38;
  undefined8 local_30;
  Index IStack_28;
  
  Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_1,_2,_false>
  ::Block(&local_200,&this->m_lhs,index);
  memcpy(local_170,&local_200,0x90);
  BlockImpl_dense<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true,_true>::BlockImpl_dense
            (&local_230,this->m_rhs,0);
  memcpy(local_e0,local_170,0x90);
  local_50 = local_230.
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true>,_0>.
             m_data;
  uStack_48 = local_230.
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true>,_0>
              ._8_8_;
  local_40 = local_230.m_xpr;
  lStack_38 = local_230.m_startRow.m_value;
  local_30 = local_230._32_8_;
  IStack_28 = local_230.m_outerStride;
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_1,_2,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_2,_1,_true>_>_>
          ::sum(local_e0);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index index) const
  {
    const Index row = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? 0 : index;
    const Index col = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? index : 0;
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }